

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

int LegacyOCSPCallback(SSL *ssl,void *arg)

{
  uint8_t *response;
  uint8_t *puVar1;
  int iVar2;
  TestConfig *pTVar3;
  uint uVar4;
  
  pTVar3 = GetTestConfig(ssl);
  iVar2 = SSL_is_server(ssl);
  if (iVar2 == 0) {
    uVar4 = pTVar3->fail_ocsp_callback ^ 1;
  }
  else {
    response = (pTVar3->ocsp_response).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    puVar1 = (pTVar3->ocsp_response).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar4 = 2;
    if (((response != puVar1) && (pTVar3->set_ocsp_in_callback == true)) &&
       (iVar2 = SSL_set_ocsp_response(ssl,response,(long)puVar1 - (long)response), iVar2 == 0)) {
      return 2;
    }
    if (pTVar3->fail_ocsp_callback == false) {
      uVar4 = (uint)pTVar3->decline_ocsp_callback + (uint)pTVar3->decline_ocsp_callback * 2;
    }
  }
  return uVar4;
}

Assistant:

static int LegacyOCSPCallback(SSL *ssl, void *arg) {
  const TestConfig *config = GetTestConfig(ssl);
  if (!SSL_is_server(ssl)) {
    return !config->fail_ocsp_callback;
  }

  if (!config->ocsp_response.empty() && config->set_ocsp_in_callback &&
      !SSL_set_ocsp_response(ssl, (const uint8_t *)config->ocsp_response.data(),
                             config->ocsp_response.size())) {
    return SSL_TLSEXT_ERR_ALERT_FATAL;
  }
  if (config->fail_ocsp_callback) {
    return SSL_TLSEXT_ERR_ALERT_FATAL;
  }
  if (config->decline_ocsp_callback) {
    return SSL_TLSEXT_ERR_NOACK;
  }
  return SSL_TLSEXT_ERR_OK;
}